

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O0

bool loadPrograms(void)

{
  bool bVar1;
  undefined1 local_9;
  bool v;
  
  local_9 = loadViewerProgram();
  if (local_9) {
    bVar1 = loadTerrainProgram();
    local_9 = local_9 && bVar1;
  }
  if (local_9 != false) {
    bVar1 = loadSubdCsLodProgram();
    local_9 = (local_9 & bVar1) != 0;
  }
  if (local_9 != false) {
    bVar1 = loadUpdateIndirectPrograms();
    local_9 = (local_9 & bVar1) != 0;
  }
  return local_9;
}

Assistant:

bool loadPrograms()
{
    bool v = true;

    if (v) v &= loadViewerProgram();
    if (v) v &= loadTerrainProgram();
    if (v) v &= loadSubdCsLodProgram();
    if (v) v &= loadUpdateIndirectPrograms();

    return v;
}